

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind_def.cpp
# Opt level: O1

OmegaOP * slopeOP(vector<double,_std::allocator<double>_> *data,
                 vector<double,_std::allocator<double>_> *states,double penalty,string *constraint,
                 double minAngle,string *type)

{
  double *pdVar1;
  int iVar2;
  OmegaOP *this;
  
  this = (OmegaOP *)operator_new(0x78);
  pdVar1 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  OmegaOP::OmegaOP(this,states,*pdVar1,penalty,
                   (uint)((ulong)((long)(data->super__Vector_base<double,_std::allocator<double>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1) >>
                         3));
  iVar2 = std::__cxx11::string::compare((char *)type);
  if (iVar2 == 0) {
    iVar2 = std::__cxx11::string::compare((char *)constraint);
    if (iVar2 == 0) {
      OmegaOP::algo(this,data);
    }
  }
  iVar2 = std::__cxx11::string::compare((char *)type);
  if (iVar2 == 0) {
    iVar2 = std::__cxx11::string::compare((char *)constraint);
    if (iVar2 == 0) {
      OmegaOP::algoChannel(this,data);
    }
  }
  iVar2 = std::__cxx11::string::compare((char *)type);
  if (iVar2 == 0) {
    iVar2 = std::__cxx11::string::compare((char *)constraint);
    if (iVar2 == 0) {
      OmegaOP::algoPruning(this,data);
    }
  }
  iVar2 = std::__cxx11::string::compare((char *)constraint);
  if (iVar2 == 0) {
    OmegaOP::algoISOTONIC(this,data);
  }
  iVar2 = std::__cxx11::string::compare((char *)constraint);
  if (iVar2 == 0) {
    OmegaOP::algoUNIMODAL(this,data);
  }
  iVar2 = std::__cxx11::string::compare((char *)constraint);
  if (iVar2 == 0) {
    OmegaOP::algoSMOOTHING(this,data,minAngle);
  }
  OmegaOP::backtracking
            (this,(uint)((ulong)((long)(data->super__Vector_base<double,_std::allocator<double>_>).
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)(data->super__Vector_base<double,_std::allocator<double>_>).
                                      _M_impl.super__Vector_impl_data._M_start) >> 3));
  return this;
}

Assistant:

OmegaOP *slopeOP(std::vector<double> data, std::vector<double> states, double penalty,
               std::string constraint = "null", double minAngle = 0, std::string type = "channel")
{
    OmegaOP *omega = new OmegaOP(states, data[0], penalty, data.size());

    //DIFFERENT PRUNING + NO CONSTRAINT
    if(type == "null" && constraint == "null"){omega->algo(data);}
    if(type == "channel" && constraint == "null"){omega->algoChannel(data);}
    if(type == "pruning" && constraint == "null"){omega->algoPruning(data);}

    //DIFFERENT CONSTRAINTS
    if(constraint == "isotonic"){omega->algoISOTONIC(data);}
    if(constraint == "unimodal"){omega->algoUNIMODAL(data);}
    if(constraint == "smoothing"){omega->algoSMOOTHING(data, minAngle);}

    omega->backtracking(data.size());

    return omega;
}